

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_callback_activate_nolock_(event_base *base,event_callback *evcb)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  unsigned_long uVar4;
  long lVar5;
  void *pvVar6;
  eventop *peVar7;
  eventop *peVar8;
  short sVar9;
  uint uVar10;
  int iVar11;
  int extraout_EAX;
  int iVar12;
  unsigned_long uVar13;
  ulong uVar14;
  char *pcVar15;
  event_callback *in_RDX;
  event_callback *extraout_RDX;
  event_callback *extraout_RDX_00;
  event_callback *extraout_RDX_01;
  event_callback *extraout_RDX_02;
  char *pcVar16;
  event_callback *extraout_RDX_03;
  event_callback *extraout_RDX_04;
  event_callback *extraout_RDX_05;
  event_callback *extraout_RDX_06;
  event_callback *extraout_RDX_07;
  event_callback *extraout_RDX_08;
  event_callback *extraout_RDX_09;
  event_callback *extraout_RDX_10;
  event_callback *extraout_RDX_11;
  event_callback *extraout_RDX_12;
  event_callback *extraout_RDX_13;
  event_callback *extraout_RDX_14;
  event_callback *extraout_RDX_15;
  event_callback *extraout_RDX_16;
  long lVar17;
  event_callback *extraout_RDX_17;
  _func_void_int_short_void_ptr *p_Var18;
  undefined1 *puVar19;
  event *ev;
  uint uVar20;
  void *pvVar21;
  short *psVar22;
  event_callback *peVar23;
  char *pcVar24;
  long lVar25;
  evthread_lock_callbacks *unaff_R12;
  int unaff_R13D;
  timeval *ptVar26;
  bool bVar27;
  
  puVar19 = &stack0xffffffffffffffe8;
  p_Var18 = (_func_void_int_short_void_ptr *)0x0;
  iVar12 = 0;
  if ((evcb->evcb_flags & 0x40U) != 0) {
    UINT_0023084c._3_1_ = 0xff;
    return 0;
  }
  uVar10 = (ushort)evcb->evcb_flags >> 3 & 5;
  switch(uVar10) {
  case 0:
    iVar12 = 1;
    break;
  case 1:
    goto switchD_001daa6d_caseD_1;
  default:
    pvVar21 = base->th_base_lock;
    if (pvVar21 != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,pvVar21);
    }
    event_callback_finalize_nolock_
              (base,(uint)pvVar21,in_RDX,
               (_func_void_event_callback_ptr_void_ptr *)&switchD_001daa6d::switchdataD_00230840);
    if (base->th_base_lock != (void *)0x0) {
      iVar12 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      return iVar12;
    }
    return extraout_EAX;
  case 4:
    event_queue_remove_active_later(base,evcb);
    iVar12 = 0;
    break;
  case 5:
    goto switchD_001daa6d_caseD_5;
  case 6:
    peVar23 = evcb;
code_r0x001dc5f7:
    *(undefined8 *)(puVar19 + -8) = 0x1dc5fa;
    (*evthread_lock_fns_.unlock)((uint)base,peVar23);
    in_RDX = extraout_RDX_09;
LAB_001dc5fa:
    pvVar21 = (((event *)unaff_R12)->ev_evcallback).evcb_arg;
    *(undefined8 *)(puVar19 + -8) = 0x1dc604;
    (*p_Var18)((int)unaff_R12,(short)pvVar21,in_RDX);
    in_RDX = extraout_RDX_10;
LAB_001dc7eb:
    base = *(event_base **)(puVar19 + 8);
    unaff_R12 = &evthread_lock_fns_;
LAB_001dc7f7:
    pvVar21 = evcb[10].evcb_arg;
    if (pvVar21 != (void *)0x0) {
      p_Var18 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
      *(undefined8 *)(puVar19 + -8) = 0x1dc80a;
      (*p_Var18)(0,(short)pvVar21,in_RDX);
    }
    evcb[0xb].evcb_flags = 0;
    evcb[0xb].evcb_pri = '\0';
    evcb[0xb].evcb_closure = '\0';
    *(undefined4 *)&evcb[0xb].field_0x14 = 0;
    if (*(int *)&evcb[0xb].evcb_active_next.tqe_prev != 0) {
      *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
      peVar23 = evcb[0xb].evcb_active_next.tqe_next;
      if (peVar23 != (event_callback *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc845;
        (*evthread_cond_fns_.signal_condition)(peVar23,1);
      }
    }
    if (*(int *)((long)&evcb[5].evcb_cb_union + 4) != 0) {
      return -1;
    }
    if (*(int *)(puVar19 + 0x34) <= unaff_R13D) {
      return unaff_R13D;
    }
    if ((base != (event_base *)0x0) && (unaff_R13D != 0)) {
      evcb[8].evcb_cb_union.evcb_callback = (_func_void_int_short_void_ptr *)0x0;
      if (((ulong)evcb[0xb].evcb_cb_union & 8) == 0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc882;
        gettime((event_base *)evcb,*(timeval **)(puVar19 + 0x38));
      }
      *(undefined8 *)(puVar19 + -8) = 0x1dc88f;
      gettime((event_base *)evcb,(timeval *)(puVar19 + 0x10));
      peVar7 = base->evsel;
      peVar8 = *(eventop **)(puVar19 + 0x10);
      bVar27 = SBORROW8((long)peVar8,(long)peVar7);
      lVar17 = (long)peVar8 - (long)peVar7;
      if (peVar8 == peVar7) {
        bVar27 = SBORROW8(*(long *)(puVar19 + 0x18),(long)base->evbase);
        lVar17 = *(long *)(puVar19 + 0x18) - (long)base->evbase;
      }
      if (bVar27 == lVar17 < 0) {
        return unaff_R13D;
      }
    }
    if (*(int *)&evcb[5].evcb_arg != 0) {
      return unaff_R13D;
    }
    unaff_R12 = (evthread_lock_callbacks *)**(undefined8 **)(puVar19 + 0x40);
    if ((event *)unaff_R12 == (event *)0x0) {
      return unaff_R13D;
    }
    uVar3 = (((event *)unaff_R12)->ev_evcallback).evcb_flags;
    if ((char)uVar3 < '\0') {
      if ((uVar3 & 0x40) == 0 && (((event *)unaff_R12)->ev_events & 0x10U) == 0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc3eb;
        event_del_nolock_((event *)unaff_R12,0);
        in_RDX = extraout_RDX_02;
      }
      else {
        *(undefined8 *)(puVar19 + -8) = 0x1dc3df;
        event_queue_remove_active((event_base *)evcb,(event_callback *)unaff_R12);
        in_RDX = extraout_RDX_01;
      }
      ev = (event *)unaff_R12;
      if (event_debug_logging_mask_ != 0) {
        uVar3 = ((event *)unaff_R12)->ev_res;
        pcVar16 = "EV_READ ";
        if ((uVar3 & 2) == 0) {
          pcVar16 = " ";
        }
        pcVar15 = "EV_WRITE ";
        if ((uVar3 & 4) == 0) {
          pcVar15 = " ";
        }
        pcVar24 = "EV_CLOSED ";
        if (-1 < (char)uVar3) {
          pcVar24 = " ";
        }
        p_Var18 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
        *(undefined8 *)(puVar19 + -8) = 0x1dc444;
        event_debugx_("event_process_active: event: %p, %s%s%scall %p",unaff_R12,pcVar16,pcVar15,
                      pcVar24,p_Var18);
        in_RDX = extraout_RDX_03;
      }
    }
    else {
      *(undefined8 *)(puVar19 + -8) = 0x1dc394;
      event_queue_remove_active((event_base *)evcb,(event_callback *)unaff_R12);
      in_RDX = extraout_RDX;
      if (event_debug_logging_mask_ != 0) {
        bVar1 = (((event *)unaff_R12)->ev_evcallback).evcb_closure;
        p_Var18 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
        *(undefined8 *)(puVar19 + -8) = 0x1dc3bc;
        event_debugx_("event_process_active: event_callback %p, closure %d, call %p",unaff_R12,
                      (ulong)bVar1,p_Var18);
        in_RDX = extraout_RDX_00;
      }
      ev = (event *)0x0;
    }
    unaff_R13D = unaff_R13D +
                 (uint)(((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x10U) == 0);
    *(evthread_lock_callbacks **)&evcb[0xb].evcb_flags = unaff_R12;
    *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
    uVar2 = (((event *)unaff_R12)->ev_evcallback).evcb_closure;
    switch(uVar2) {
    case '\0':
      if (ev == (event *)0x0) goto LAB_001dc8e5;
      p_Var18 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
      sVar9 = ev->ev_res;
      pvVar21 = evcb[10].evcb_arg;
      unaff_R12 = &evthread_lock_fns_;
      if (pvVar21 != (void *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc635;
        (*evthread_lock_fns_.unlock)(0,pvVar21);
      }
      iVar12 = ev->ev_fd;
      pvVar21 = (ev->ev_evcallback).evcb_arg;
      *(undefined8 *)(puVar19 + -8) = 0x1dc642;
      (*p_Var18)(iVar12,sVar9,pvVar21);
      base = *(event_base **)(puVar19 + 8);
      in_RDX = extraout_RDX_11;
      goto LAB_001dc7f7;
    case '\x01':
      if (ev == (event *)0x0) goto LAB_001dc8ea;
      sVar9 = (ev->ev_).ev_signal.ev_ncalls;
      *(short *)(puVar19 + 0x10) = sVar9;
      if (sVar9 != 0) {
        (ev->ev_).ev_signal.ev_pncalls = (short *)(puVar19 + 0x10);
      }
      pvVar21 = evcb[10].evcb_arg;
      base = *(event_base **)(puVar19 + 8);
      unaff_R12 = &evthread_lock_fns_;
      if (pvVar21 != (void *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc68b;
        (*evthread_lock_fns_.unlock)(0,pvVar21);
        in_RDX = extraout_RDX_12;
      }
      do {
        if (*(short *)(puVar19 + 0x10) == 0) goto LAB_001dc7f7;
        sVar9 = *(short *)(puVar19 + 0x10) + -1;
        *(short *)(puVar19 + 0x10) = sVar9;
        (ev->ev_).ev_signal.ev_ncalls = sVar9;
        if (sVar9 == 0) {
          (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        iVar12 = ev->ev_fd;
        sVar9 = ev->ev_res;
        pvVar21 = (ev->ev_evcallback).evcb_arg;
        p_Var18 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        *(undefined8 *)(puVar19 + -8) = 0x1dc6bd;
        (*p_Var18)(iVar12,sVar9,pvVar21);
        pvVar21 = evcb[10].evcb_arg;
        if (pvVar21 == (void *)0x0) {
          iVar12 = *(int *)((long)&evcb[5].evcb_cb_union + 4);
          in_RDX = extraout_RDX_13;
        }
        else {
          *(undefined8 *)(puVar19 + -8) = 0x1dc6d0;
          (*evthread_lock_fns_.lock)(0,pvVar21);
          pvVar21 = evcb[10].evcb_arg;
          iVar12 = *(int *)((long)&evcb[5].evcb_cb_union + 4);
          in_RDX = extraout_RDX_14;
          if (pvVar21 != (void *)0x0) {
            *(undefined8 *)(puVar19 + -8) = 0x1dc6ea;
            (*evthread_lock_fns_.unlock)(0,pvVar21);
            in_RDX = extraout_RDX_15;
          }
        }
      } while (iVar12 == 0);
      if (*(short *)(puVar19 + 0x10) != 0) {
        (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
      }
      goto LAB_001dc7f7;
    case '\x02':
      goto switchD_001dc488_caseD_2;
    case '\x03':
      p_Var18 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
      peVar23 = (event_callback *)evcb[10].evcb_arg;
      if (peVar23 == (event_callback *)0x0) goto LAB_001dc5fa;
      base = (event_base *)0x0;
      goto code_r0x001dc5f7;
    case '\x04':
      p_Var18 = (((event *)unaff_R12)->ev_evcallback).evcb_cb_union.evcb_callback;
      evcb[0xb].evcb_flags = 0;
      evcb[0xb].evcb_pri = '\0';
      evcb[0xb].evcb_closure = '\0';
      *(undefined4 *)&evcb[0xb].field_0x14 = 0;
      if (((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x40) == 0) goto LAB_001dc8ef;
      pvVar21 = evcb[10].evcb_arg;
      if (pvVar21 != (void *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc536;
        (*evthread_lock_fns_.unlock)(0,pvVar21);
        in_RDX = extraout_RDX_07;
      }
      pvVar21 = (((event *)unaff_R12)->ev_evcallback).evcb_arg;
      *(undefined8 *)(puVar19 + -8) = 0x1dc541;
      (*p_Var18)((int)unaff_R12,(short)pvVar21,in_RDX);
      in_RDX = extraout_RDX_08;
      goto LAB_001dc7eb;
    case '\x05':
    case '\x06':
      if (ev == (event *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc8db;
        event_process_active_single_queue_cold_3();
LAB_001dc8db:
        *(undefined8 *)(puVar19 + -8) = 0x1dc8e0;
        event_process_active_single_queue_cold_2();
        goto LAB_001dc8e0;
      }
      evcb[0xb].evcb_flags = 0;
      evcb[0xb].evcb_pri = '\0';
      evcb[0xb].evcb_closure = '\0';
      *(undefined4 *)&evcb[0xb].field_0x14 = 0;
      if (((((event *)unaff_R12)->ev_evcallback).evcb_flags & 0x40) == 0) goto LAB_001dc8db;
      p_Var18 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
      pvVar21 = evcb[10].evcb_arg;
      unaff_R12 = &evthread_lock_fns_;
      if (pvVar21 != (void *)0x0) {
        *(undefined8 *)(puVar19 + -8) = 0x1dc4c8;
        (*evthread_lock_fns_.unlock)(0,pvVar21);
        in_RDX = extraout_RDX_04;
      }
      pvVar21 = (ev->ev_evcallback).evcb_arg;
      *(undefined8 *)(puVar19 + -8) = 0x1dc4d1;
      (*p_Var18)((int)ev,(short)pvVar21,in_RDX);
      *(undefined8 *)(puVar19 + -8) = 0x1dc4d9;
      event_debug_note_teardown_(ev);
      base = *(event_base **)(puVar19 + 8);
      in_RDX = extraout_RDX_05;
      if (uVar2 == '\x06') {
        if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
          *(undefined8 *)(puVar19 + -8) = 0x1dc715;
          free(ev);
          in_RDX = extraout_RDX_16;
        }
        else {
          *(undefined8 *)(puVar19 + -8) = 0x1dc4fd;
          (*mm_free_fn_)(ev);
          in_RDX = extraout_RDX_06;
        }
      }
      goto LAB_001dc7f7;
    default:
      goto switchD_001dc488_default;
    }
  case 7:
    bRamffffffff8b48387d = bRamffffffff8b48387d & 0x40;
    puVar19 = &stack0xffffffffffffffe0;
    UINT_0023084c._3_1_ = (char)(&switchD_001daa6d::switchdataD_00230840)[uVar10] + '@';
    goto LAB_001dc7f7;
  }
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar11 = evthread_is_debug_lock_held_(base->th_base_lock), iVar11 == 0)) {
    event_callback_activate_nolock__cold_2();
LAB_001dab8e:
    event_callback_activate_nolock__cold_1();
switchD_001daa6d_caseD_5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xbcb,"0","event_callback_activate_nolock_");
  }
  if ((evcb->evcb_flags & 8U) == 0) {
    iVar11 = base->event_count + (uint)((evcb->evcb_flags & 0x10U) == 0);
    base->event_count = iVar11;
    if (iVar11 < base->event_count_max) {
      iVar11 = base->event_count_max;
    }
    base->event_count_max = iVar11;
    *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 8;
    iVar11 = base->event_count_active + 1;
    base->event_count_active = iVar11;
    if (iVar11 < base->event_count_active_max) {
      iVar11 = base->event_count_active_max;
    }
    base->event_count_active_max = iVar11;
    bVar1 = evcb->evcb_pri;
    if (base->nactivequeues <= (int)(uint)bVar1) goto LAB_001dab8e;
    (evcb->evcb_active_next).tqe_next = (event_callback *)0x0;
    (evcb->evcb_active_next).tqe_prev = base->activequeues[bVar1].tqh_last;
    *base->activequeues[bVar1].tqh_last = evcb;
    base->activequeues[evcb->evcb_pri].tqh_last = (event_callback **)evcb;
  }
  if (((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) &&
     (uVar4 = base->th_owner_id, uVar13 = (*evthread_id_fn_)(), uVar4 != uVar13)) {
    evthread_notify_base(base);
  }
switchD_001daa6d_caseD_1:
  return iVar12;
switchD_001dc488_caseD_2:
  if (ev == (event *)0x0) {
LAB_001dc8e0:
    *(undefined8 *)(puVar19 + -8) = 0x1dc8e5;
    event_process_active_single_queue_cold_6();
LAB_001dc8e5:
    *(undefined8 *)(puVar19 + -8) = 0x1dc8ea;
    event_process_active_single_queue_cold_4();
LAB_001dc8ea:
    *(undefined8 *)(puVar19 + -8) = 0x1dc8ef;
    event_process_active_single_queue_cold_7();
LAB_001dc8ef:
    *(undefined8 *)(puVar19 + -8) = 0x1dc8f4;
    event_process_active_single_queue_cold_1();
    *(undefined8 *)(puVar19 + -8) = 0x1dc8f9;
    event_process_active_single_queue_cold_8();
LAB_001dc8f9:
    *(undefined8 *)(puVar19 + -8) = 0x1dc8fe;
    event_process_active_single_queue_cold_5();
switchD_001dc488_default:
    *(code **)(puVar19 + -8) = evthread_notify_base_eventfd;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x6c2,"0","event_process_active_single_queue");
  }
  uVar14 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if ((ev->ev_).ev_io.ev_timeout.tv_sec == 0 && uVar14 == 0) goto LAB_001dc7b8;
  if (0xfffff < (uVar14 ^ (ev->ev_timeout).tv_usec)) goto LAB_001dc8f9;
  ptVar26 = &ev->ev_timeout;
  *(undefined8 *)(puVar19 + -8) = 0x1dc581;
  gettime((event_base *)evcb,(timeval *)(puVar19 + 0x20));
  uVar14 = (ev->ev_timeout).tv_usec;
  if ((((uint)uVar14 & 0xf0000000) == 0x50000000) &&
     ((int)((uint)(uVar14 >> 0x14) & 0xff) < *(int *)&evcb[7].evcb_active_next.tqe_prev)) {
    lVar17 = (ev->ev_).ev_io.ev_timeout.tv_sec;
    uVar20 = (uint)(ev->ev_).ev_io.ev_timeout.tv_usec;
    uVar10 = uVar20 & 0xfff00000;
    psVar22 = (short *)(ulong)(uVar20 & 0xfffff);
    if ((ev->ev_res & 1) == 0) {
      uVar14 = *(ulong *)(puVar19 + 0x28);
      ptVar26 = (timeval *)(puVar19 + 0x20);
    }
    else {
      uVar14 = (ulong)((uint)uVar14 & 0xfffff);
    }
  }
  else {
    bVar27 = (ev->ev_res & 1) == 0;
    lVar17 = (ev->ev_).ev_io.ev_timeout.tv_sec;
    if (bVar27) {
      uVar14 = *(ulong *)(puVar19 + 0x28);
    }
    psVar22 = (ev->ev_).ev_signal.ev_pncalls;
    if (bVar27) {
      ptVar26 = (timeval *)(puVar19 + 0x20);
    }
    uVar10 = 0;
  }
  lVar25 = ptVar26->tv_sec + lVar17;
  *(long *)(puVar19 + 0x10) = lVar25;
  uVar14 = uVar14 + (long)psVar22;
  if (999999 < (long)uVar14) {
    lVar25 = lVar25 + 1;
    *(long *)(puVar19 + 0x10) = lVar25;
    uVar14 = uVar14 - 1000000;
  }
  lVar5 = *(long *)(puVar19 + 0x20);
  if (lVar25 == lVar5) {
    lVar25 = *(long *)(puVar19 + 0x28);
    if ((long)uVar14 < lVar25) {
LAB_001dc778:
      *(long *)(puVar19 + 0x10) = lVar5 + lVar17;
      uVar14 = lVar25 + (long)psVar22;
      if (999999 < (long)uVar14) {
        *(long *)(puVar19 + 0x10) = lVar5 + lVar17 + 1;
        uVar14 = uVar14 - 1000000;
      }
    }
  }
  else if (lVar25 < lVar5) {
    lVar25 = *(long *)(puVar19 + 0x28);
    goto LAB_001dc778;
  }
  *(ulong *)(puVar19 + 0x18) = uVar10 | uVar14;
  *(undefined8 *)(puVar19 + -8) = 0x1dc7b8;
  event_add_nolock_(ev,(timeval *)(puVar19 + 0x10),1);
LAB_001dc7b8:
  p_Var18 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
  pvVar21 = (ev->ev_evcallback).evcb_arg;
  iVar12 = ev->ev_fd;
  sVar9 = ev->ev_res;
  pvVar6 = evcb[10].evcb_arg;
  if (pvVar6 != (void *)0x0) {
    *(undefined8 *)(puVar19 + -8) = 0x1dc7e0;
    (*evthread_lock_fns_.unlock)(0,pvVar6);
  }
  *(undefined8 *)(puVar19 + -8) = 0x1dc7eb;
  (*p_Var18)(iVar12,sVar9,pvVar21);
  in_RDX = extraout_RDX_17;
  goto LAB_001dc7eb;
}

Assistant:

int
event_callback_activate_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	int r = 1;

	if (evcb->evcb_flags & EVLIST_FINALIZING)
		return 0;

	switch (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
	default:
		EVUTIL_ASSERT(0);
		EVUTIL_FALLTHROUGH;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		r = 0;
		break;
	case EVLIST_ACTIVE:
		return 0;
	case 0:
		break;
	}

	event_queue_insert_active(base, evcb);

	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	return r;
}